

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unary.cpp
# Opt level: O0

void __thiscall DragonParser::InterNamespace::Unary::Unary(Unary *this,Token *tkn,Expr *x)

{
  Type *t;
  Expr *x_local;
  Token *tkn_local;
  Unary *this_local;
  
  t = SymbolNamespace::Type::max(SymbolNamespace::Type::Int,&x->type);
  Op::Op(&this->super_Op,tkn,t);
  (this->super_Op).super_Expr._vptr_Expr = (_func_int **)&PTR_gen_00110d68;
  Expr::Expr(&this->expr);
  Expr::operator=(&this->expr,x);
  return;
}

Assistant:

Unary::Unary(Token &tkn, Expr &x) :
            Op(tkn,
               const_cast<Type&>(*Type::max(const_cast<Type&>(*(Type::Int)), x.type))) {
        expr = x;
    }